

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall
AddrManImpl::Unserialize<HashVerifier<DataStream>>(AddrManImpl *this,HashVerifier<DataStream> *s_)

{
  ConstevalFormatString<0U> fmt;
  ConstevalFormatString<2U> fmt_00;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined4 uVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  string *psVar7;
  undefined8 uVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  reference ppVar12;
  mapped_type *pmVar13;
  pointer pvVar14;
  long in_RDI;
  long in_FS_OFFSET;
  int bucket_position;
  AddrInfo *info_2;
  int entry_index_1;
  int bucket_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  bool restore_bucketing;
  int n_2;
  int nKBucketPos;
  int nKBucket;
  int n_1;
  AddrInfo *info;
  int n;
  int check_code;
  _Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> itCopy;
  const_iterator it;
  int nLostUnk;
  pair<int,_int> bucket_entry;
  iterator __end1;
  iterator __begin1;
  int entry_index;
  int num_entries;
  int bucket;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bucket_entries;
  int nLost;
  int nUBuckets;
  uint8_t lowest_compatible;
  uint8_t compat;
  ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> s;
  SerParams ser_params;
  Format format;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  uint256 serialized_asmap_checksum;
  uint256 supplied_asmap_checksum;
  AddrInfo info_1;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  char *in_stack_fffffffffffffbf0;
  AddrInfo *in_stack_fffffffffffffbf8;
  CNetAddr *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  char *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  uchar *in_stack_fffffffffffffc30;
  undefined5 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3d;
  undefined1 in_stack_fffffffffffffc3e;
  undefined1 in_stack_fffffffffffffc3f;
  undefined1 fNew;
  AddrInfo *in_stack_fffffffffffffc40;
  AddrInfo *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  Network in_stack_fffffffffffffc54;
  mapped_type in_stack_fffffffffffffc58;
  mapped_type *in_stack_fffffffffffffc68;
  NetGroupManager *in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  int in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc98;
  Network in_stack_fffffffffffffc9c;
  size_t in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  mapped_type *in_stack_fffffffffffffcb0;
  AddrManImpl *in_stack_fffffffffffffcb8;
  SerParams *local_320;
  int local_2c0;
  int local_2b4;
  AddrManImpl *in_stack_fffffffffffffd50;
  int local_2a4;
  Level in_stack_fffffffffffffd90;
  int *in_stack_fffffffffffffda0;
  _Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> in_stack_fffffffffffffda8;
  undefined1 local_23c [16];
  size_type sStack_22c;
  pair<int,_int> *local_228;
  pair<int,_int> *local_220;
  direct_or_indirect local_1f4 [2];
  Network local_1cc;
  int local_1c8;
  Network local_1c4;
  long local_1c0;
  long local_1b8;
  undefined4 local_1b0;
  undefined4 local_1ac;
  uint local_1a8;
  undefined1 local_1a4;
  byte local_1a3;
  byte local_1a2;
  byte local_1a1;
  SerParams local_190;
  Format *local_188;
  byte local_179;
  undefined1 local_90;
  undefined4 local_8c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
             (AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
             in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
             SUB41((uint)in_stack_fffffffffffffc08 >> 0x18,0));
  bVar3 = std::vector<long,_std::allocator<long>_>::empty
                    ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffbf8);
  if (!bVar3) {
    __assert_fail("vRandom.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0xeb,
                  "void AddrManImpl::Unserialize(Stream &) [Stream = HashVerifier<DataStream>]");
  }
  local_188 = (Format *)
              Using<CustomUintFormatter<1,false>,AddrManImpl::Format&>
                        ((Format *)in_stack_fffffffffffffbf0);
  HashVerifier<DataStream>::operator>>
            ((HashVerifier<DataStream> *)in_stack_fffffffffffffbf8,
             (Wrapper<CustomUintFormatter<1,_false>,_AddrManImpl::Format_&> *)
             in_stack_fffffffffffffbf0);
  if (local_179 < 3) {
    local_320 = &CAddress::V1_DISK;
  }
  else {
    local_320 = &CAddress::V2_DISK;
  }
  local_190 = *local_320;
  ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams>::ParamsStream
            ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
             in_stack_fffffffffffffbf8,(HashVerifier<DataStream> *)in_stack_fffffffffffffbf0,
             (SerParams *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
            ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
             in_stack_fffffffffffffbf8,(uchar *)in_stack_fffffffffffffbf0);
  if (local_1a1 < 0x20) {
    psVar7 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_char,unsigned_char>
              ((char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
               (uchar *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (uchar *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    std::ios_base::failure[abi:cxx11]::failure(psVar7);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(psVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    local_1a2 = local_1a1 - 0x20;
    if (local_1a2 < 5) {
      ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                 in_stack_fffffffffffffbf8,(uint256 *)in_stack_fffffffffffffbf0);
      ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                 in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
      ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                 in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
      local_1a8 = 0;
      ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                 in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
      if (local_179 != 0) {
        local_1a8 = local_1a8 ^ 0x40000000;
      }
      if ((*(int *)(in_RDI + 0x20178) < 0x10001) && (-1 < *(int *)(in_RDI + 0x20178))) {
        if ((*(int *)(in_RDI + 0x170) < 0x4001) && (-1 < *(int *)(in_RDI + 0x170))) {
          for (local_2a4 = 0; local_2a4 < *(int *)(in_RDI + 0x20178); local_2a4 = local_2a4 + 1) {
            local_1b8 = (long)local_2a4;
            in_stack_fffffffffffffcb8 =
                 (AddrManImpl *)
                 std::
                 unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                 ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                               *)in_stack_fffffffffffffbf8,(key_type *)in_stack_fffffffffffffbf0);
            in_stack_fffffffffffffd50 = in_stack_fffffffffffffcb8;
            ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                      ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                       in_stack_fffffffffffffbf8,(AddrInfo *)in_stack_fffffffffffffbf0);
            in_stack_fffffffffffffca8 = (char *)(long)local_2a4;
            in_stack_fffffffffffffcb0 =
                 std::
                 unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
                 ::operator[]((unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
                               *)in_stack_fffffffffffffbf8,(key_type *)in_stack_fffffffffffffbf0);
            *in_stack_fffffffffffffcb0 = (mapped_type)in_stack_fffffffffffffca8;
            in_stack_fffffffffffffca0 = in_RDI + 0x158;
            sVar9 = std::vector<long,_std::allocator<long>_>::size
                              ((vector<long,_std::allocator<long>_> *)
                               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            *(int *)((in_stack_fffffffffffffd50->insecure_rand).rng.m_buffer._M_elems + 0x14) =
                 (int)sVar9;
            local_1c0 = (long)local_2a4;
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                       (value_type_conflict3 *)0x88e022);
            in_stack_fffffffffffffc9c = CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffbf0);
            local_1c4 = in_stack_fffffffffffffc9c;
            pmVar10 = std::
                      unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                      ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                                    *)in_stack_fffffffffffffbf8,
                                   (key_type *)in_stack_fffffffffffffbf0);
            pmVar10->n_new = pmVar10->n_new + 1;
          }
          *(long *)(in_RDI + 0xd0) = (long)*(int *)(in_RDI + 0x20178);
          local_1c8 = 0;
          for (local_2b4 = 0; local_2b4 < *(int *)(in_RDI + 0x170); local_2b4 = local_2b4 + 1) {
            AddrInfo::AddrInfo(in_stack_fffffffffffffc40);
            ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                      ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                       in_stack_fffffffffffffbf8,(AddrInfo *)in_stack_fffffffffffffbf0);
            iVar5 = AddrInfo::GetTriedBucket
                              ((AddrInfo *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                               (uint256 *)
                               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                               in_stack_fffffffffffffc70);
            in_stack_fffffffffffffc84 = iVar5;
            iVar6 = AddrInfo::GetBucketPosition
                              (in_stack_fffffffffffffc48,(uint256 *)in_stack_fffffffffffffc40,
                               (bool)in_stack_fffffffffffffc3f,
                               (int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
            in_stack_fffffffffffffc80 = iVar6;
            in_stack_fffffffffffffc7f = CNetAddr::IsValid(in_stack_fffffffffffffc00);
            if (((bool)in_stack_fffffffffffffc7f) &&
               (*(long *)(in_RDI + 0x178 + (long)iVar5 * 0x200 + (long)iVar6 * 8) == -1)) {
              in_stack_fffffffffffffc70 = (NetGroupManager *)(in_RDI + 0x158);
              sVar9 = std::vector<long,_std::allocator<long>_>::size
                                ((vector<long,_std::allocator<long>_> *)
                                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
              local_8c = (undefined4)sVar9;
              local_90 = 1;
              std::vector<long,_std::allocator<long>_>::push_back
                        ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffbf8,
                         (value_type_conflict3 *)in_stack_fffffffffffffbf0);
              in_stack_fffffffffffffc68 =
                   std::
                   unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                   ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                                 *)in_stack_fffffffffffffbf8,(key_type *)in_stack_fffffffffffffbf0);
              AddrInfo::operator=(in_stack_fffffffffffffbf8,(AddrInfo *)in_stack_fffffffffffffbf0);
              in_stack_fffffffffffffc58 = *(mapped_type *)(in_RDI + 0xd0);
              pmVar11 = std::
                        unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
                        ::operator[]((unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
                                      *)in_stack_fffffffffffffbf8,
                                     (key_type *)in_stack_fffffffffffffbf0);
              *pmVar11 = in_stack_fffffffffffffc58;
              *(undefined8 *)(in_RDI + (long)iVar5 * 0x200 + 0x178 + (long)iVar6 * 8) =
                   *(undefined8 *)(in_RDI + 0xd0);
              *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xd0) + 1;
              in_stack_fffffffffffffc48 = (AddrInfo *)(in_RDI + 0xa01c8);
              in_stack_fffffffffffffc54 =
                   CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffbf0);
              local_1cc = in_stack_fffffffffffffc54;
              in_stack_fffffffffffffc40 =
                   (AddrInfo *)
                   std::
                   unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                   ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                                 *)in_stack_fffffffffffffbf8,(key_type *)in_stack_fffffffffffffbf0);
              *(size_t *)
               ((long)&(in_stack_fffffffffffffc40->super_CAddress).super_CService.super_CNetAddr.
                       m_addr._union + 8) =
                   *(size_t *)
                    ((long)&(in_stack_fffffffffffffc40->super_CAddress).super_CService.
                            super_CNetAddr.m_addr._union + 8) + 1;
            }
            else {
              local_1c8 = local_1c8 + 1;
            }
            AddrInfo::~AddrInfo((AddrInfo *)
                                CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          }
          *(int *)(in_RDI + 0x170) = *(int *)(in_RDI + 0x170) - local_1c8;
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          for (local_1f4[0].indirect_contents.capacity = 0; (int)local_1f4[0]._8_4_ < (int)local_1a8
              ; local_1f4[0]._8_4_ = local_1f4[0].indirect_contents.capacity + 1) {
            local_1f4[0]._4_4_ = 0;
            ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                      ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                       in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
            for (local_2c0 = 0; local_2c0 < (int)local_1f4[0]._4_4_; local_2c0 = local_2c0 + 1) {
              local_1f4[0]._0_4_ = 0;
              ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                        ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                         in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
              if ((-1 < (int)local_1f4[0]._0_4_) &&
                 ((int)local_1f4[0]._0_4_ < *(int *)(in_RDI + 0x20178))) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                emplace_back<int&,int&>
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                           (int *)in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
              }
            }
          }
          NetGroupManager::GetAsmapChecksum((NetGroupManager *)in_stack_fffffffffffffc00);
          uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
          ;
          if (1 < local_179) {
            ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>::operator>>
                      ((ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *)
                       in_stack_fffffffffffffbf8,(uint256 *)in_stack_fffffffffffffbf0);
          }
          bVar3 = false;
          if (local_1a8 == 0x400) {
            bVar3 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffbf8,
                                 (base_blob<256U> *)in_stack_fffffffffffffbf0);
          }
          fNew = bVar3;
          if ((bVar3 == false) &&
             (bVar4 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffbec,
                                                   in_stack_fffffffffffffbe8),Trace), bVar4)) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                       (char *)in_stack_fffffffffffffc00);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                       (char *)in_stack_fffffffffffffc00);
            in_stack_fffffffffffffbf0 =
                 "Bucketing method was updated, re-bucketing addrman entries from disk\n";
            in_stack_fffffffffffffbe8 = 1;
            logging_function._M_str = (char *)in_stack_fffffffffffffcb8;
            logging_function._M_len = (size_t)in_stack_fffffffffffffcb0;
            source_file._M_str = in_stack_fffffffffffffca8;
            source_file._M_len = in_stack_fffffffffffffca0;
            fmt.fmt._4_4_ = in_stack_fffffffffffffc9c;
            fmt.fmt._0_4_ = in_stack_fffffffffffffc98;
            LogPrintFormatInternal<>
                      (logging_function,source_file,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       in_stack_fffffffffffffd90,fmt);
          }
          local_220 = (pair<int,_int> *)
                      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  *)in_stack_fffffffffffffbf0);
          local_228 = (pair<int,_int> *)
                      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  *)in_stack_fffffffffffffbf0);
          while (bVar4 = __gnu_cxx::
                         operator==<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                   ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)in_stack_fffffffffffffbf8,
                                    (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)in_stack_fffffffffffffbf0), ((bVar4 ^ 0xffU) & 1) != 0) {
            ppVar12 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ::operator*((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            unique0x00012000 = *ppVar12;
            uVar1 = local_23c._12_4_;
            sVar2 = sStack_22c;
            local_23c._4_8_ = SEXT48((int)sStack_22c);
            pmVar13 = std::
                      unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                      ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                                    *)in_stack_fffffffffffffbf8,
                                   (key_type *)in_stack_fffffffffffffbf0);
            bVar4 = CNetAddr::IsValid(in_stack_fffffffffffffc00);
            if ((bVar4) && (pmVar13->nRefCount < 8)) {
              iVar5 = AddrInfo::GetBucketPosition
                                (in_stack_fffffffffffffc48,(uint256 *)in_stack_fffffffffffffc40,
                                 (bool)fNew,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
              if ((bVar3 == false) ||
                 (*(long *)(in_RDI + 0x20180 + (long)(int)uVar1 * 0x200 + (long)iVar5 * 8) != -1)) {
                iVar5 = AddrInfo::GetNewBucket
                                  (in_stack_fffffffffffffbf8,(uint256 *)in_stack_fffffffffffffbf0,
                                   (NetGroupManager *)
                                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                iVar6 = AddrInfo::GetBucketPosition
                                  (in_stack_fffffffffffffc48,(uint256 *)in_stack_fffffffffffffc40,
                                   (bool)fNew,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
                if (*(long *)(in_RDI + 0x20180 + (long)iVar5 * 0x200 + (long)iVar6 * 8) == -1) {
                  *(long *)(in_RDI + 0x20180 + (long)iVar5 * 0x200 + (long)iVar6 * 8) =
                       (long)(int)sVar2;
                  pmVar13->nRefCount = pmVar13->nRefCount + 1;
                }
              }
              else {
                *(long *)(in_RDI + 0x20180 + (long)(int)uVar1 * 0x200 + (long)iVar5 * 8) =
                     (long)(int)sVar2;
                pmVar13->nRefCount = pmVar13->nRefCount + 1;
              }
            }
            __gnu_cxx::
            __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::operator++((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          }
          local_23c._0_4_ = 0;
          std::
          unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
          ::cbegin((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                    *)in_stack_fffffffffffffbf0);
          while( true ) {
            std::
            unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
            ::cend((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                    *)in_stack_fffffffffffffbf0);
            bVar3 = std::__detail::operator==
                              ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                               in_stack_fffffffffffffbf8,
                               (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                               in_stack_fffffffffffffbf0);
            iVar5 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            pvVar14 = std::__detail::
                      _Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
                      operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>
                                  *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            if ((((pvVar14->second).fInTried & 1U) == 0) &&
               (pvVar14 = std::__detail::
                          _Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
                          operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>
                                      *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8
                                                )), (pvVar14->second).nRefCount == 0)) {
              in_stack_fffffffffffffda8._M_cur =
                   (__node_type *)
                   std::__detail::
                   _Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::operator++
                             ((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *
                              )in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
              std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
              operator->((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
              Delete((AddrManImpl *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                     CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
              local_23c._0_4_ = local_23c._0_4_ + 1;
            }
            else {
              std::__detail::_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
              operator++((_Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            }
          }
          if (0 < local_1c8 + local_23c._0_4_) {
            bVar3 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8
                                                ),Trace);
            in_stack_fffffffffffffc1c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffc1c);
            if (bVar3) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                         (char *)in_stack_fffffffffffffc00);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                         (char *)in_stack_fffffffffffffc00);
              in_stack_fffffffffffffbf8 = (AddrInfo *)local_23c;
              in_stack_fffffffffffffbe8 = 1;
              logging_function_00._M_str = (char *)in_stack_fffffffffffffcb8;
              logging_function_00._M_len = (size_t)in_stack_fffffffffffffcb0;
              source_file_00._M_str = in_stack_fffffffffffffca8;
              source_file_00._M_len = in_stack_fffffffffffffca0;
              fmt_00.fmt._4_4_ = in_stack_fffffffffffffc9c;
              fmt_00.fmt._0_4_ = in_stack_fffffffffffffc98;
              LogPrintFormatInternal<int,int>
                        (logging_function_00,source_file_00,iVar5,
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         in_stack_fffffffffffffd90,fmt_00,in_stack_fffffffffffffda0,
                         (int *)in_stack_fffffffffffffda8._M_cur);
            }
          }
          iVar5 = CheckAddrman(in_stack_fffffffffffffd50);
          if (iVar5 == 0) {
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       in_stack_fffffffffffffbf8);
            UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              return;
            }
          }
          else {
            psVar7 = (string *)__cxa_allocate_exception(0x20);
            tinyformat::format<int>((char *)CONCAT44(in_stack_fffffffffffffc1c,iVar5),(int *)psVar7)
            ;
            std::ios_base::failure[abi:cxx11]::failure(psVar7);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(psVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
          }
        }
        else {
          psVar7 = (string *)__cxa_allocate_exception(0x20);
          local_1b0 = 0x4000;
          tinyformat::format<int,int>
                    ((char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                     (int *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                     (int *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
          std::ios_base::failure[abi:cxx11]::failure(psVar7);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(psVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
      }
      else {
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        local_1ac = 0x10000;
        tinyformat::format<int,int>
                  ((char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                   (int *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (int *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        std::ios_base::failure[abi:cxx11]::failure(psVar7);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(psVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
    }
    else {
      uVar8 = __cxa_allocate_exception(0x20);
      local_1a3 = local_179;
      local_1a4 = 4;
      tinyformat::format<unsigned_char,unsigned_char,char[13],unsigned_char>
                ((char *)CONCAT17(in_stack_fffffffffffffc3f,
                                  CONCAT16(in_stack_fffffffffffffc3e,
                                           CONCAT15(in_stack_fffffffffffffc3d,
                                                    in_stack_fffffffffffffc38))),
                 in_stack_fffffffffffffc30,
                 (uchar *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                 (char (*) [13])CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (uchar *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      InvalidAddrManVersionError::InvalidAddrManVersionError
                ((InvalidAddrManVersionError *)in_stack_fffffffffffffbf8,
                 (string *)in_stack_fffffffffffffbf0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar8,&InvalidAddrManVersionError::typeinfo,
                    InvalidAddrManVersionError::~InvalidAddrManVersionError);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Unserialize(Stream& s_)
{
    LOCK(cs);

    assert(vRandom.empty());

    Format format;
    s_ >> Using<CustomUintFormatter<1>>(format);

    const auto ser_params = (format >= Format::V3_BIP155 ? CAddress::V2_DISK : CAddress::V1_DISK);
    ParamsStream s{s_, ser_params};

    uint8_t compat;
    s >> compat;
    if (compat < INCOMPATIBILITY_BASE) {
        throw std::ios_base::failure(strprintf(
            "Corrupted addrman database: The compat value (%u) "
            "is lower than the expected minimum value %u.",
            compat, INCOMPATIBILITY_BASE));
    }
    const uint8_t lowest_compatible = compat - INCOMPATIBILITY_BASE;
    if (lowest_compatible > FILE_FORMAT) {
        throw InvalidAddrManVersionError(strprintf(
            "Unsupported format of addrman database: %u. It is compatible with formats >=%u, "
            "but the maximum supported by this version of %s is %u.",
            uint8_t{format}, lowest_compatible, PACKAGE_NAME, uint8_t{FILE_FORMAT}));
    }

    s >> nKey;
    s >> nNew;
    s >> nTried;
    int nUBuckets = 0;
    s >> nUBuckets;
    if (format >= Format::V1_DETERMINISTIC) {
        nUBuckets ^= (1 << 30);
    }

    if (nNew > ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nNew < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                    nNew,
                    ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    if (nTried > ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nTried < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                    nTried,
                    ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    // Deserialize entries from the new table.
    for (int n = 0; n < nNew; n++) {
        AddrInfo& info = mapInfo[n];
        s >> info;
        mapAddr[info] = n;
        info.nRandomPos = vRandom.size();
        vRandom.push_back(n);
        m_network_counts[info.GetNetwork()].n_new++;
    }
    nIdCount = nNew;

    // Deserialize entries from the tried table.
    int nLost = 0;
    for (int n = 0; n < nTried; n++) {
        AddrInfo info;
        s >> info;
        int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
        int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);
        if (info.IsValid()
                && vvTried[nKBucket][nKBucketPos] == -1) {
            info.nRandomPos = vRandom.size();
            info.fInTried = true;
            vRandom.push_back(nIdCount);
            mapInfo[nIdCount] = info;
            mapAddr[info] = nIdCount;
            vvTried[nKBucket][nKBucketPos] = nIdCount;
            nIdCount++;
            m_network_counts[info.GetNetwork()].n_tried++;
        } else {
            nLost++;
        }
    }
    nTried -= nLost;

    // Store positions in the new table buckets to apply later (if possible).
    // An entry may appear in up to ADDRMAN_NEW_BUCKETS_PER_ADDRESS buckets,
    // so we store all bucket-entry_index pairs to iterate through later.
    std::vector<std::pair<int, int>> bucket_entries;

    for (int bucket = 0; bucket < nUBuckets; ++bucket) {
        int num_entries{0};
        s >> num_entries;
        for (int n = 0; n < num_entries; ++n) {
            int entry_index{0};
            s >> entry_index;
            if (entry_index >= 0 && entry_index < nNew) {
                bucket_entries.emplace_back(bucket, entry_index);
            }
        }
    }

    // If the bucket count and asmap checksum haven't changed, then attempt
    // to restore the entries to the buckets/positions they were in before
    // serialization.
    uint256 supplied_asmap_checksum{m_netgroupman.GetAsmapChecksum()};
    uint256 serialized_asmap_checksum;
    if (format >= Format::V2_ASMAP) {
        s >> serialized_asmap_checksum;
    }
    const bool restore_bucketing{nUBuckets == ADDRMAN_NEW_BUCKET_COUNT &&
        serialized_asmap_checksum == supplied_asmap_checksum};

    if (!restore_bucketing) {
        LogDebug(BCLog::ADDRMAN, "Bucketing method was updated, re-bucketing addrman entries from disk\n");
    }

    for (auto bucket_entry : bucket_entries) {
        int bucket{bucket_entry.first};
        const int entry_index{bucket_entry.second};
        AddrInfo& info = mapInfo[entry_index];

        // Don't store the entry in the new bucket if it's not a valid address for our addrman
        if (!info.IsValid()) continue;

        // The entry shouldn't appear in more than
        // ADDRMAN_NEW_BUCKETS_PER_ADDRESS. If it has already, just skip
        // this bucket_entry.
        if (info.nRefCount >= ADDRMAN_NEW_BUCKETS_PER_ADDRESS) continue;

        int bucket_position = info.GetBucketPosition(nKey, true, bucket);
        if (restore_bucketing && vvNew[bucket][bucket_position] == -1) {
            // Bucketing has not changed, using existing bucket positions for the new table
            vvNew[bucket][bucket_position] = entry_index;
            ++info.nRefCount;
        } else {
            // In case the new table data cannot be used (bucket count wrong or new asmap),
            // try to give them a reference based on their primary source address.
            bucket = info.GetNewBucket(nKey, m_netgroupman);
            bucket_position = info.GetBucketPosition(nKey, true, bucket);
            if (vvNew[bucket][bucket_position] == -1) {
                vvNew[bucket][bucket_position] = entry_index;
                ++info.nRefCount;
            }
        }
    }

    // Prune new entries with refcount 0 (as a result of collisions or invalid address).
    int nLostUnk = 0;
    for (auto it = mapInfo.cbegin(); it != mapInfo.cend(); ) {
        if (it->second.fInTried == false && it->second.nRefCount == 0) {
            const auto itCopy = it++;
            Delete(itCopy->first);
            ++nLostUnk;
        } else {
            ++it;
        }
    }
    if (nLost + nLostUnk > 0) {
        LogDebug(BCLog::ADDRMAN, "addrman lost %i new and %i tried addresses due to collisions or invalid addresses\n", nLostUnk, nLost);
    }

    const int check_code{CheckAddrman()};
    if (check_code != 0) {
        throw std::ios_base::failure(strprintf(
            "Corrupt data. Consistency check failed with code %s",
            check_code));
    }
}